

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.cpp
# Opt level: O2

void __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::~PersistentStorageJson
          (PersistentStorageJson *this)

{
  (this->super_PersistentStorage)._vptr_PersistentStorage =
       (_func_int **)&PTR__PersistentStorageJson_00348318;
  CacheToFile(this);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::clear(&this->mCache);
  ot::os::semaphore::SemaphoreClose(&this->mStorageLock);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&this->mCache);
  std::__cxx11::string::~string((string *)&this->mFileName);
  return;
}

Assistant:

PersistentStorageJson::~PersistentStorageJson()
{
    Close();
    mCache.clear();
    SemaphoreClose(mStorageLock);
}